

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

DispatchBuilder * __thiscall kern::DispatchBuilder::max_level(DispatchBuilder *this,LogLevel level)

{
  Dispatch *pDVar1;
  invalid_argument *this_00;
  undefined8 *puVar2;
  
  pDVar1 = this->inner;
  if (pDVar1 == (Dispatch *)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = &PTR__exception_00109b68;
    __cxa_throw(puVar2,&BuilderReuseException::typeinfo,std::exception::~exception);
  }
  if ((level != 0) && (((int)(char)level & (int)(char)level - 1U) == 0)) {
    pDVar1->log_level = level * '\x02' - Trace;
    pDVar1->is_def_level = false;
    return this;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"level must not be a combined value");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

DispatchBuilder &DispatchBuilder::max_level(LogLevel level) {
        if(this->inner == nullptr)
            throw BuilderReuseException();

        char lvl = static_cast<char>(level);
        if(lvl == 0 || (lvl & (lvl - 1)) != 0)
            throw std::invalid_argument("level must not be a combined value");

        this->inner->log_level = static_cast<LogLevel>((lvl << 1) - 1);
        this->inner->is_def_level = false;

        return *this;
    }